

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O2

void __thiscall avro::NodeMap::printJson(NodeMap *this,ostream *os,int depth)

{
  indent x;
  const_reference pvVar1;
  
  std::operator<<(os,"{\n");
  x.d = depth + 1;
  operator<<(os,x);
  std::operator<<(os,"\"type\": \"map\",\n");
  operator<<(os,x);
  std::operator<<(os,"\"values\": ");
  pvVar1 = std::
           vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
           at(&(this->super_NodeImplMap).leafAttributes_.attrs_,1);
  (*pvVar1->px->_vptr_Node[0xd])(pvVar1->px,os,(ulong)(uint)x.d);
  std::operator<<(os,'\n');
  operator<<(os,(indent)depth);
  std::operator<<(os,'}');
  return;
}

Assistant:

void 
NodeMap::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(depth+1) <<"\"type\": \"map\",\n";
    os << indent(depth+1) << "\"values\": ";
    leafAttributes_.get(1)->printJson(os, depth+1);
    os << '\n';
    os << indent(depth) << '}';
}